

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbeat_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::HeartbeatMessageTest_test_encode_Test::TestBody
          (HeartbeatMessageTest_test_encode_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_98;
  Message local_90 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  ByteBuffer local_40 [8];
  ByteBuffer buffer;
  HeartbeatMessageTest_test_encode_Test *this_local;
  
  bidfx_public_api::price::pixie::HeartbeatMessage::HeartbeatMessage
            ((HeartbeatMessage *)&gtest_ar.message_);
  bidfx_public_api::price::pixie::HeartbeatMessage::Encode((int)local_40);
  bidfx_public_api::tools::BufferUtil::BufferAsHex_abi_cxx11_((ByteBuffer *)&local_78);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_58,"\"48\"","BufferUtil::BufferAsHex(buffer)",
             (char (*) [3])"48",&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(local_90);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/heartbeat_message_test.cpp"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_40);
  return;
}

Assistant:

TEST(HeartbeatMessageTest, test_encode)
{
    ByteBuffer buffer = HeartbeatMessage().Encode(PixieVersion::CURRENT_VERSION);
    EXPECT_EQ("48", BufferUtil::BufferAsHex(buffer));
}